

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_posix.h
# Opt level: O3

uint64_t snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::dev_urandom(void)

{
  int __fd;
  uint64_t in_RAX;
  ssize_t sVar1;
  int *piVar2;
  long lVar3;
  anon_union_8_2_fa62e37e anon_var_0;
  uint64_t local_18;
  
  local_18 = in_RAX;
  __fd = open("/dev/urandom",0x80000,0);
  if (__fd < 1) {
LAB_001069d0:
    error("Failed to get system randomness");
  }
  lVar3 = 0;
  do {
    sVar1 = read(__fd,(void *)((long)&local_18 + lVar3),8 - lVar3);
    if (sVar1 < 1) {
      piVar2 = __errno_location();
      if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
        close(__fd);
        goto LAB_001069d0;
      }
    }
    else {
      lVar3 = lVar3 + sVar1;
    }
    if (lVar3 == 8) {
      close(__fd);
      return local_18;
    }
  } while( true );
}

Assistant:

static uint64_t dev_urandom()
    {
      union
      {
        uint64_t result;
        char buffer[sizeof(uint64_t)];
      };

      ssize_t ret;
      int flags = O_RDONLY;
#if defined(O_CLOEXEC)
      flags |= O_CLOEXEC;
#endif
      auto fd = open("/dev/urandom", flags, 0);
      if (fd > 0)
      {
        auto current = stl::begin(buffer);
        auto target = stl::end(buffer);
        while (auto length = static_cast<size_t>(target - current))
        {
          ret = read(fd, current, length);
          if (ret <= 0)
          {
            if (errno != EAGAIN && errno != EINTR)
            {
              break;
            }
          }
          else
          {
            current += ret;
          }
        }
        ret = close(fd);
        SNMALLOC_ASSERT(0 == ret);
        if (SNMALLOC_LIKELY(target == current))
        {
          return result;
        }
      }

      error("Failed to get system randomness");
    }